

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

int h264_macroblock_layer
              (bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  int *piVar1;
  uint mb_type;
  h264_seqparm *phVar2;
  h264_picparm *phVar3;
  bool bVar4;
  int iVar5;
  uint32_t ival;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  long lVar9;
  
  phVar2 = slice->seqparm;
  phVar3 = slice->picparm;
  puVar8 = &mb->mb_type;
  iVar5 = h264_mb_type(str,cabac,slice->slice_type,puVar8);
  if (iVar5 != 0) goto LAB_00104c7f;
  uVar6 = (ulong)*puVar8;
  if (0x37 < uVar6) goto LAB_00104f2a;
  if ((0x800000c0000000U >> (uVar6 & 0x3f) & 1) == 0) {
    if ((0x4000001UL >> (uVar6 & 0x3f) & 1) != 0) {
      if (phVar3->transform_8x8_mode_flag == 0) {
        iVar5 = vs_infer(str,&mb->transform_size_8x8_flag,0);
      }
      else {
        iVar5 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
      }
      if (iVar5 != 0) goto LAB_00104c7f;
LAB_00104f2a:
      iVar5 = h264_mb_pred(str,cabac,slice,mb);
      bVar4 = true;
      goto LAB_00104f46;
    }
    if (uVar6 != 0x19) goto LAB_00104f2a;
    iVar5 = vs_align_byte(str,VS_ALIGN_0);
    if (iVar5 != 0) goto LAB_00104c7f;
    lVar9 = 0x14;
    do {
      iVar5 = vs_u(str,(uint32_t *)((long)mb->pcm_sample_luma + lVar9 + -0x14),
                   slice->bit_depth_luma_minus8 + 8);
      if (iVar5 != 0) goto LAB_00104c7f;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x414);
    if ((slice->chroma_array_type != 0) && (0 < 0x40 << ((byte)slice->chroma_array_type & 0x1f))) {
      puVar8 = mb->pcm_sample_chroma;
      lVar9 = 0;
      do {
        iVar5 = vs_u(str,puVar8,slice->bit_depth_chroma_minus8 + 8);
        if (iVar5 != 0) goto LAB_00104c7f;
        lVar9 = lVar9 + 1;
        puVar8 = puVar8 + 1;
      } while (lVar9 < 0x40 << ((byte)slice->chroma_array_type & 0x1f));
    }
    if (((((cabac != (h264_cabac_context *)0x0) &&
          (iVar5 = h264_cabac_init_arith(str,cabac), iVar5 != 0)) ||
         (iVar5 = vs_infers(str,&mb->mb_qp_delta,0), iVar5 != 0)) ||
        ((iVar5 = vs_infer(str,&mb->transform_size_8x8_flag,0), iVar5 != 0 ||
         (iVar5 = vs_infer(str,&mb->coded_block_pattern,0x2f), iVar5 != 0)))) ||
       (iVar5 = vs_infer(str,&mb->intra_chroma_pred_mode,0), iVar5 != 0)) goto LAB_00104c7f;
    iVar5 = infer_intra(str,mb,0);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = infer_intra(str,mb,1);
    if (iVar5 != 0) {
      return 1;
    }
    lVar9 = -0x11;
    do {
      mb->coded_block_flag[1][lVar9] = 1;
      mb->coded_block_flag[2][lVar9] = 1;
      mb[1].pcm_sample_luma[lVar9 + -5] = 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
    lVar9 = -0x10;
    do {
      piVar1 = mb->total_coeff[1] + lVar9;
      piVar1[0] = 0x10;
      piVar1[1] = 0x10;
      piVar1[2] = 0x10;
      piVar1[3] = 0x10;
      *(undefined8 *)((long)(mb->coded_block_flag + -1) + (lVar9 + 1) * 4) = 0x1000000010;
      *(undefined8 *)((int *)((long)(mb->coded_block_flag + -1) + (lVar9 + 1) * 4) + 2) =
           0x1000000010;
      piVar1 = mb->coded_block_flag[0] + lVar9;
      piVar1[0] = 0x10;
      piVar1[1] = 0x10;
      piVar1[2] = 0x10;
      piVar1[3] = 0x10;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0);
LAB_001050c7:
    iVar5 = 0;
  }
  else {
    iVar5 = h264_sub_mb_pred(str,cabac,slice,mb);
    if (iVar5 != 0) goto LAB_00104c7f;
    bVar4 = true;
    lVar9 = 0;
    do {
      if ((ulong)mb->sub_mb_type[lVar9] == 4) {
        if (phVar2->direct_8x8_inference_flag == 0) {
          bVar4 = false;
        }
      }
      else if (sub_mb_part_info[mb->sub_mb_type[lVar9]][0] != 0) {
        bVar4 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    iVar5 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
LAB_00104f46:
    if (iVar5 != 0) {
      return 1;
    }
    mb_type = *puVar8;
    if (((mb_type == 0) || (mb_type == 0x1a)) || (0x19 < mb_type)) {
      iVar5 = h264_coded_block_pattern
                        (str,cabac,mb_type,(uint)(slice->chroma_array_type - 1 < 2),
                         &mb->coded_block_pattern);
      if (iVar5 == 0) {
        if (0x19 < *puVar8) {
          if ((((mb->coded_block_pattern & 0xf) == 0) || (phVar3->transform_8x8_mode_flag == 0)) ||
             ((!bVar4 || ((*puVar8 == 0x21 && (phVar2->direct_8x8_inference_flag == 0))))))
          goto LAB_0010503d;
          iVar5 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
          goto LAB_00105044;
        }
LAB_0010504c:
        if ((mb->coded_block_pattern == 0) && (*puVar8 - 0x19 < 0xffffffe8)) {
          iVar5 = vs_infers(str,&mb->mb_qp_delta,0);
        }
        else {
          iVar5 = h264_mb_qp_delta(str,cabac,&mb->mb_qp_delta);
        }
        if (iVar5 == 0) {
          iVar5 = h264_residual(str,cabac,slice,mb,0,0xf);
          if (iVar5 != 0) {
            return 1;
          }
          goto LAB_001050c7;
        }
      }
    }
    else {
      uVar7 = ((mb_type - 1 >> 2) % 3) * 0x10;
      ival = uVar7 + 0xf;
      if (mb_type < 0xd) {
        ival = uVar7;
      }
      iVar5 = vs_infer(str,&mb->coded_block_pattern,ival);
      if (iVar5 == 0) {
LAB_0010503d:
        iVar5 = vs_infer(str,&mb->transform_size_8x8_flag,0);
LAB_00105044:
        if (iVar5 == 0) goto LAB_0010504c;
      }
    }
LAB_00104c7f:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int h264_macroblock_layer(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	struct h264_picparm *picparm = slice->picparm;
	struct h264_seqparm *seqparm = slice->seqparm;
	if (h264_mb_type(str, cabac, slice->slice_type, &mb->mb_type)) return 1;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		if (vs_align_byte(str, VS_ALIGN_0)) return 1;
		int i;
		for (i = 0; i < 256; i++)
			if (vs_u(str, &mb->pcm_sample_luma[i], slice->bit_depth_luma_minus8 + 8)) return 1;
		if (slice->chroma_array_type) {
			for (i = 0; i < (64 << slice->chroma_array_type); i++)
				if (vs_u(str, &mb->pcm_sample_chroma[i], slice->bit_depth_chroma_minus8 + 8)) return 1;
		}
		if (cabac)
			if (h264_cabac_init_arith(str, cabac)) return 1;
		if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		if (vs_infer(str, &mb->coded_block_pattern, 0x2f)) return 1;
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
		for (i = 0; i < 17; i++) {
			mb->coded_block_flag[0][i] = 1;
			mb->coded_block_flag[1][i] = 1;
			mb->coded_block_flag[2][i] = 1;
		}
		for (i = 0; i < 16; i++) {
			mb->total_coeff[0][i] = 16;
			mb->total_coeff[1][i] = 16;
			mb->total_coeff[2][i] = 16;
		}
	} else {
		int noSubMbPartSizeLessThan8x8Flag = 1;
		if (h264_is_submb_mb_type(mb->mb_type)) {
			if (h264_sub_mb_pred(str, cabac, slice, mb)) return 1;
			int i;
			for (i = 0; i < 4; i++) {
				if (mb->sub_mb_type[i] != H264_SUB_MB_TYPE_B_DIRECT_8X8) {
					if (sub_mb_part_info[mb->sub_mb_type[i]][0])
						noSubMbPartSizeLessThan8x8Flag = 0;
				} else {
					if (!seqparm->direct_8x8_inference_flag)
						noSubMbPartSizeLessThan8x8Flag = 0;
				}
			}
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		} else {
			if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
				if (picparm->transform_8x8_mode_flag) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
			if (h264_mb_pred(str, cabac, slice, mb)) return 1;
		}
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI || mb->mb_type >= H264_MB_TYPE_I_END) {
			int has_chroma = slice->chroma_array_type < 3 && slice->chroma_array_type != 0;
			if (h264_coded_block_pattern(str, cabac, mb->mb_type, has_chroma, &mb->coded_block_pattern)) return 1;
			if (mb->mb_type >= H264_MB_TYPE_I_END) {
				if ((mb->coded_block_pattern & 0xf) && picparm->transform_8x8_mode_flag && noSubMbPartSizeLessThan8x8Flag && (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16 || seqparm->direct_8x8_inference_flag)) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
		} else {
			int infer_cbp = (((mb->mb_type - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
			if (mb->mb_type >= H264_MB_TYPE_I_16X16_0_0_1)
				infer_cbp |= 0xf;
			if (vs_infer(str, &mb->coded_block_pattern, infer_cbp)) return 1;
			if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		}
		if (mb->coded_block_pattern || h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (h264_mb_qp_delta(str, cabac, &mb->mb_qp_delta)) return 1;
		} else {
			if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		}
		if (h264_residual(str, cabac, slice, mb, 0, 15)) return 1;
	}
	return 0;
}